

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

bool Omega_h::inertia::anon_unknown_0::mark_axis_bisection
               (CommPtr *comm,Reals *distances,Reals *masses,Real total_mass,Real tolerance,
               Read<signed_char> *marked)

{
  Alloc *pAVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  Real RVar6;
  double dVar7;
  MinMax<double> MVar8;
  double local_198;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_168;
  string local_158;
  Write<signed_char> local_138;
  Write<double> local_128;
  Write<double> local_118;
  __0 local_108 [16];
  Write<double> local_f8;
  Write<double> local_e8;
  type f;
  Write<signed_char> local_80;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_70;
  Write<double> local_60;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_50;
  Write<signed_char> marked_1;
  
  pAVar1 = (distances->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar2 >> 3) != (int)(uVar3 >> 3)) {
    fail("assertion %s failed at %s +%d\n","n == masses.size()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
         ,0x5c);
  }
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<double>::Write(&local_60,&distances->write_);
  MVar8 = get_minmax<double>((CommPtr *)&local_50,(Read<double> *)&local_60);
  Write<double>::~Write(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  dVar7 = ABS(MVar8.max);
  if (ABS(MVar8.max) <= ABS(MVar8.min)) {
    dVar7 = ABS(MVar8.min);
  }
  local_198 = 0.0;
  for (uVar4 = 0; dVar7 = dVar7 * 0.5, uVar4 != 0x34; uVar4 = uVar4 + 1) {
    Write<double>::Write(&local_118,&distances->write_);
    if (((ulong)local_118.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_118.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_118.shared_alloc_.alloc >> 3;
    }
    std::__cxx11::string::string((string *)&local_158,"",(allocator *)local_108);
    uVar5 = (uint)(uVar2 >> 3);
    Write<signed_char>::Write(&marked_1,uVar5,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    Write<signed_char>::Write(&f.marked,&marked_1);
    Write<double>::Write(&f.distances.write_,&local_118);
    f.distance = local_198;
    Write<signed_char>::Write((Write<signed_char> *)local_108,&f.marked);
    Write<double>::Write(&local_f8,&f.distances.write_);
    local_e8.shared_alloc_.alloc = (Alloc *)f.distance;
    if (0 < (int)uVar5) {
      entering_parallel = 1;
      Write<signed_char>::Write((Write<signed_char> *)&local_158,(Write<signed_char> *)local_108);
      Write<double>::Write((Write<signed_char> *)&local_158.field_2,(Write<signed_char> *)&local_f8)
      ;
      local_138.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
      entering_parallel = 0;
      for (uVar2 = 0; (uVar5 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
        *(bool *)(local_158._M_string_length + uVar2) =
             (double)local_e8.shared_alloc_.alloc < *(double *)(local_158.field_2._8_8_ + uVar2 * 8)
        ;
      }
      (anonymous_namespace)::mark_half(Omega_h::Read<double>,double)::$_0::~__0((__0 *)&local_158);
    }
    (anonymous_namespace)::mark_half(Omega_h::Read<double>,double)::$_0::~__0(local_108);
    Write<signed_char>::Write((Write<signed_char> *)&local_158,&marked_1);
    Read<signed_char>::Read((Read<signed_char> *)&local_168,(Write<signed_char> *)&local_158);
    Write<signed_char>::~Write((Write<signed_char> *)&local_158);
    (anonymous_namespace)::mark_half(Omega_h::Read<double>,double)::$_0::~__0((__0 *)&f);
    Write<signed_char>::~Write(&marked_1);
    Write<signed_char>::operator=(&marked->write_,(Write<signed_char> *)&local_168);
    Write<signed_char>::~Write((Write<signed_char> *)&local_168);
    Write<double>::~Write(&local_118);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    Write<double>::Write(&local_128,&masses->write_);
    Write<signed_char>::Write(&local_80,&marked->write_);
    if (((ulong)local_128.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_128.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_128.shared_alloc_.alloc >> 3;
    }
    std::__cxx11::string::string((string *)&local_158,"",(allocator *)local_108);
    uVar5 = (uint)(uVar2 >> 3);
    Write<double>::Write((Write<double> *)&marked_1,uVar5,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    Write<double>::Write((Write<double> *)&f,(Write<double> *)&marked_1);
    Write<signed_char>::Write((Write<signed_char> *)&f.distances,&local_80);
    Write<double>::Write((Write<double> *)&f.distance,&local_128);
    Write<double>::Write((Write<double> *)local_108,(Write<double> *)&f);
    Write<signed_char>::Write((Write<signed_char> *)&local_f8,(Write<signed_char> *)&f.distances);
    Write<double>::Write(&local_e8,(Write<double> *)&f.distance);
    if (0 < (int)uVar5) {
      entering_parallel = 1;
      Write<double>::Write((Write<signed_char> *)&local_158,(Write<signed_char> *)local_108);
      Write<signed_char>::Write
                ((Write<signed_char> *)&local_158.field_2,(Write<signed_char> *)&local_f8);
      Write<double>::Write(&local_138,(Write<signed_char> *)&local_e8);
      entering_parallel = 0;
      for (uVar2 = 0; (uVar5 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
        *(double *)(local_158._M_string_length + uVar2 * 8) =
             (double)(int)*(char *)(local_158.field_2._8_8_ + uVar2) *
             *(double *)((long)local_138.shared_alloc_.direct_ptr + uVar2 * 8);
      }
      (anonymous_namespace)::
      get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
      ::$_0::~__0((__0 *)&local_158);
    }
    (anonymous_namespace)::
    get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
    ::$_0::~__0((__0 *)local_108);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_168,&local_70)
    ;
    Write<double>::Write((Write<double> *)local_108,(Write<double> *)&marked_1);
    Read<double>::Read((Read<signed_char> *)&local_158,(Write<double> *)local_108);
    RVar6 = repro_sum((CommPtr *)&local_168,(Reals *)&local_158);
    Write<double>::~Write((Write<double> *)&local_158);
    Write<double>::~Write((Write<double> *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
    (anonymous_namespace)::
    get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
    ::$_0::~__0((__0 *)&f);
    Write<double>::~Write((Write<double> *)&marked_1);
    Write<signed_char>::~Write(&local_80);
    Write<double>::~Write(&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    if (ABS(RVar6 - total_mass * 0.5) <= tolerance) break;
    uVar2 = -(ulong)(total_mass * 0.5 < RVar6);
    local_198 = local_198 + (double)(~uVar2 & (ulong)-dVar7 | uVar2 & (ulong)dVar7);
  }
  return uVar4 < 0x34;
}

Assistant:

bool mark_axis_bisection(CommPtr comm, Reals distances, Reals masses,
    Real total_mass, Real tolerance, Read<I8>& marked) {
  auto n = distances.size();
  OMEGA_H_CHECK(n == masses.size());
  auto minmax_dist = get_minmax(comm, distances);
  auto range = max2(std::abs(minmax_dist.min), std::abs(minmax_dist.max));
  auto step = range / 2.;
  Real distance = 0.;
  for (Int i = 0; i < MANTISSA_BITS; ++i) {
    marked = mark_half(distances, distance);
    auto half_weight = get_half_weight(comm, masses, marked);
    if (std::abs(half_weight - (total_mass / 2.)) <= tolerance) {
      return true;
    }
    if (half_weight > total_mass / 2.) {
      distance += step;
    } else {
      distance -= step;
    }
    step /= 2.;
  }
  return false;
}